

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationSpeed.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorRotationSpeed::IntLoadConstraint_Ct
          (ChLinkMotorRotationSpeed *this,uint off_L,ChVectorDynamic<> *Qc,double c)

{
  undefined1 auVar1 [16];
  int iVar2;
  double *pdVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  dVar6 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
          super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  (*((this->super_ChLinkMotorRotation).super_ChLinkMotor.m_func.
     super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ChFunction[4]
  )();
  iVar2 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr;
  if (iVar2 < 1) {
    __assert_fail("(i >= 0) && (i < nconstr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                  ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
  }
  uVar4 = iVar2 - 1;
  if (((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.constraints.
       super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar4]->super_ChConstraintTwo).super_ChConstraint.
      active == true) {
    uVar5 = (ulong)(uVar4 + off_L);
    if ((Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
        (long)uVar5) {
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    pdVar3 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = c;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pdVar3[uVar5];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar6 * -0.5;
    auVar1 = vfmadd213sd_fma(auVar7,auVar8,auVar1);
    pdVar3[uVar5] = auVar1._0_8_;
  }
  return;
}

Assistant:

void ChLinkMotorRotationSpeed::IntLoadConstraint_Ct(const unsigned int off_L, ChVectorDynamic<>& Qc, const double c) {
    double mCt = -0.5 * m_func->Get_y(this->GetChTime());

    int ncrz = mask.nconstr - 1;
    if (mask.Constr_N(ncrz).IsActive()) {
        Qc(off_L + ncrz) += c * mCt;
    }
}